

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_symbol_codec.cpp
# Opt level: O3

int __thiscall
crnlib::adaptive_huffman_data_model::init(adaptive_huffman_data_model *this,EVP_PKEY_CTX *ctx)

{
  uint uVar1;
  int extraout_EAX;
  decoder_tables *pdVar2;
  uint uVar3;
  uint in_EDX;
  ulong uVar4;
  
  clear(this);
  this->m_encoding = SUB81(ctx,0);
  uVar3 = (this->m_sym_freq).m_size;
  if (uVar3 != in_EDX) {
    if (uVar3 <= in_EDX) {
      if ((this->m_sym_freq).m_capacity < in_EDX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_sym_freq,in_EDX,uVar3 + 1 == in_EDX,2,
                   (object_mover)0x0,false);
        uVar3 = (this->m_sym_freq).m_size;
      }
      memset((this->m_sym_freq).m_p + uVar3,0,(ulong)(in_EDX - uVar3) * 2);
    }
    (this->m_sym_freq).m_size = in_EDX;
  }
  uVar3 = (this->m_code_sizes).m_size;
  if (uVar3 != in_EDX) {
    if (uVar3 <= in_EDX) {
      if ((this->m_code_sizes).m_capacity < in_EDX) {
        elemental_vector::increase_capacity
                  ((elemental_vector *)&this->m_code_sizes,in_EDX,uVar3 + 1 == in_EDX,1,
                   (object_mover)0x0,false);
        uVar3 = (this->m_code_sizes).m_size;
      }
      memset((this->m_code_sizes).m_p + uVar3,0,(ulong)(in_EDX - uVar3));
    }
    (this->m_code_sizes).m_size = in_EDX;
  }
  this->m_total_syms = in_EDX;
  uVar1 = 0;
  uVar3 = uVar1;
  if (0x10 < in_EDX) {
    uVar4 = (ulong)in_EDX;
    do {
      uVar1 = uVar1 - 1;
      uVar3 = (uint)uVar4;
      uVar4 = uVar4 >> 1;
    } while (3 < uVar3);
    uVar3 = (((uint)(2 << (~(byte)uVar1 & 0x1f)) < in_EDX) + 1) - uVar1;
    if (10 < uVar3) {
      uVar3 = 0xb;
    }
    if (uVar1 == 0xffffffe0) {
      uVar3 = 0xb;
    }
  }
  this->m_decoder_table_bits = (uint8)uVar3;
  if (this->m_encoding == true) {
    uVar3 = (this->m_codes).m_size;
    if (uVar3 != in_EDX) {
      if (uVar3 <= in_EDX) {
        if ((this->m_codes).m_capacity < in_EDX) {
          elemental_vector::increase_capacity
                    ((elemental_vector *)&this->m_codes,in_EDX,uVar3 + 1 == in_EDX,2,
                     (object_mover)0x0,false);
          uVar3 = (this->m_codes).m_size;
        }
        memset((this->m_codes).m_p + uVar3,0,(ulong)(in_EDX - uVar3) * 2);
      }
      (this->m_codes).m_size = in_EDX;
    }
  }
  else {
    pdVar2 = (decoder_tables *)crnlib_malloc(0xc0);
    pdVar2->m_table_shift = 0;
    pdVar2->m_table_max_code = 0;
    pdVar2->m_decode_start_code_size = 0;
    pdVar2->m_sorted_symbol_order = (uint16 *)0x0;
    *(undefined8 *)&pdVar2->m_cur_lookup_size = 0;
    *(undefined8 *)((long)&pdVar2->m_lookup + 4) = 0;
    this->m_pDecode_tables = pdVar2;
  }
  reset(this);
  return extraout_EAX;
}

Assistant:

void adaptive_huffman_data_model::init(bool encoding, uint total_syms)
    {
        clear();

        m_encoding = encoding;

        m_sym_freq.resize(total_syms);
        m_code_sizes.resize(total_syms);

        m_total_syms = total_syms;

        if (m_total_syms <= 16)
        {
            m_decoder_table_bits = 0;
        }
        else
        {
            m_decoder_table_bits = static_cast<uint8>(math::minimum(1 + math::ceil_log2i(m_total_syms), prefix_coding::cMaxTableBits));
        }

        if (m_encoding)
        {
            m_codes.resize(total_syms);
        }
        else
        {
            m_pDecode_tables = crnlib_new<prefix_coding::decoder_tables>();
        }

        reset();
    }